

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O3

void __thiscall
pg::DTLSolver::attractVertices
          (DTLSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G,int max_prio)

{
  uint uVar1;
  Game *pGVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ostream *poVar6;
  int iVar7;
  int to;
  int *piVar8;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  _label_vertex local_58;
  bitset *local_48;
  bitset *local_40;
  bitset *local_38;
  
  pGVar2 = (this->super_Solver).game;
  piVar8 = pGVar2->_inedges;
  iVar7 = pGVar2->_firstins[v];
  uVar11 = piVar8[iVar7];
  if (uVar11 != 0xffffffff) {
    piVar8 = piVar8 + iVar7;
    local_48 = Z;
    local_40 = G;
    local_38 = R;
    do {
      puVar3 = Z->_bits;
      uVar5 = (ulong)(int)uVar11;
      uVar12 = uVar5 >> 6;
      uVar10 = 1L << (uVar5 & 0x3f);
      if ((puVar3[uVar12] >> (uVar5 & 0x3f) & 1) == 0) {
        if (((local_38->_bits[uVar12] & uVar10) != 0) &&
           ((pGVar2 = (this->super_Solver).game, max_prio < 0 ||
            (pGVar2->_priority[uVar5] <= max_prio)))) {
          puVar4 = (pGVar2->_owner)._bits;
          if ((uint)((puVar4[uVar12] & uVar10) != 0) != pl) {
            uVar1 = pGVar2->_outedges[pGVar2->_firstouts[uVar5]];
            if (uVar1 != 0xffffffff) {
              puVar9 = (uint *)(pGVar2->_outedges + (long)pGVar2->_firstouts[uVar5] + 1);
              do {
                if (((local_40->_bits[(ulong)(long)(int)uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) !=
                     0) && ((puVar3[(ulong)(long)(int)uVar1 >> 6] & 1L << ((ulong)uVar1 & 0x3f)) ==
                            0)) goto LAB_001782d6;
                uVar1 = *puVar9;
                puVar9 = puVar9 + 1;
              } while (uVar1 != 0xffffffff);
            }
          }
          puVar3[uVar12] = puVar3[uVar12] | uVar10;
          iVar7 = -1;
          if ((uint)((puVar4[uVar12] & uVar10) != 0) == pl) {
            iVar7 = v;
          }
          this->str[uVar5] = iVar7;
          iVar7 = (this->Q).pointer;
          (this->Q).pointer = iVar7 + 1;
          (this->Q).queue[iVar7] = uVar11;
          if (2 < (this->super_Solver).trace) {
            poVar6 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"\x1b[1;37mattracted \x1b[36m",0x16);
            local_58.g = (this->super_Solver).game;
            local_58.v = uVar11;
            poVar6 = operator<<(poVar6,&local_58);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m by \x1b[1;36m",0xe);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m",3);
            poVar6 = (this->super_Solver).logger;
            if ((uint)(((((this->super_Solver).game)->_owner)._bits[uVar12] & uVar10) != 0) == pl) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," (via ",6);
              local_58.g = (this->super_Solver).game;
              local_58.v = v;
              poVar6 = operator<<(poVar6,&local_58);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
              std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              Z = local_48;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," (forced)",9);
              std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              Z = local_48;
            }
          }
        }
      }
      else if (((uint)(((((this->super_Solver).game)->_owner)._bits[uVar12] & uVar10) != 0) == pl)
              && (this->str[uVar5] == -1)) {
        this->str[uVar5] = v;
      }
LAB_001782d6:
      uVar11 = piVar8[1];
      piVar8 = piVar8 + 1;
    } while (uVar11 != 0xffffffff);
  }
  return;
}

Assistant:

void
DTLSolver::attractVertices(const int pl, const int v, bitset &R, bitset &Z, bitset &G, const int max_prio)
{
    // attract vertices with an edge to <v>
    for (auto curedge = ins(v); *curedge != -1; curedge++) {
        int from = *curedge;
        if (Z[from]) {
            // already in Z, maybe set strategy (for vertices in the original target set)
            if (owner(from) == pl and str[from] == -1) str[from] = v;
        } else if (R[from] and (max_prio < 0 or priority(from) <= max_prio)) {
            if (owner(from) != pl) {
                // check if opponent can escape
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !Z[to]) {
                        escapes = true;
                        break;
                    }
                }
                if (escapes) continue;
            }
            // attract
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}